

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_type_safe::object_ref<debugger_type,_false>_&,_const_debugger_type_&> * __thiscall
Catch::ExprLhs<type_safe::object_ref<debugger_type,false>const&>::operator!=
          (BinaryExpr<const_type_safe::object_ref<debugger_type,_false>_&,_const_debugger_type_&>
           *__return_storage_ptr__,ExprLhs<type_safe::object_ref<debugger_type,false>const&> *this,
          debugger_type *rhs)

{
  object_ref<debugger_type,_false> *lhs;
  bool comparisonResult;
  StringRef local_30;
  debugger_type *local_20;
  debugger_type *rhs_local;
  ExprLhs<const_type_safe::object_ref<debugger_type,_false>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (debugger_type *)this;
  this_local = (ExprLhs<const_type_safe::object_ref<debugger_type,_false>_&> *)
               __return_storage_ptr__;
  comparisonResult =
       compareNotEqual<type_safe::object_ref<debugger_type,false>,debugger_type_const&>
                 (*(object_ref<debugger_type,_false> **)this,rhs);
  lhs = *(object_ref<debugger_type,_false> **)this;
  StringRef::StringRef(&local_30,"!=");
  BinaryExpr<const_type_safe::object_ref<debugger_type,_false>_&,_const_debugger_type_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }